

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

void interleave(uint8_t *out,uint8_t *source,uint64_t outSize)

{
  undefined1 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128i *v2;
  __m128i *v1;
  uint64_t vOutSize;
  ulong local_130;
  ulong local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  uint64_t i_1;
  __m128i hi;
  __m128i lo;
  __m128i b;
  __m128i a;
  uint64_t i;
  uint8_t *sOut;
  uint8_t *t2;
  uint8_t *t1;
  __m128i *vOut;
  
  local_c0 = in_RDI;
  local_b8 = (undefined8 *)((long)in_RSI + (in_RDX + 1 >> 1));
  local_b0 = in_RSI;
  for (local_e0 = 0; local_e0 < in_RDX >> 5; local_e0 = local_e0 + 1) {
    uVar2 = *local_b0;
    uVar3 = local_b0[1];
    uVar4 = *local_b8;
    uVar5 = local_b8[1];
    hi[1]._0_1_ = (undefined1)uVar2;
    hi[1]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
    hi[1]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
    hi[1]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
    hi[1]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
    hi[1]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
    hi[1]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
    hi[1]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    i_1._0_1_ = (undefined1)uVar4;
    i_1._1_1_ = (undefined1)((ulong)uVar4 >> 8);
    i_1._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
    i_1._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
    i_1._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
    i_1._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
    i_1._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
    i_1._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
    a[0]._0_1_ = (undefined1)uVar3;
    a[0]._1_1_ = (undefined1)((ulong)uVar3 >> 8);
    a[0]._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
    a[0]._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
    a[0]._4_1_ = (undefined1)((ulong)uVar3 >> 0x20);
    a[0]._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
    a[0]._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
    a[0]._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
    b[0]._0_1_ = (undefined1)uVar5;
    b[0]._1_1_ = (undefined1)((ulong)uVar5 >> 8);
    b[0]._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
    b[0]._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
    b[0]._4_1_ = (undefined1)((ulong)uVar5 >> 0x20);
    b[0]._5_1_ = (undefined1)((ulong)uVar5 >> 0x28);
    b[0]._6_1_ = (undefined1)((ulong)uVar5 >> 0x30);
    b[0]._7_1_ = (undefined1)((ulong)uVar5 >> 0x38);
    *local_c0 = CONCAT17(i_1._3_1_,
                         CONCAT16(hi[1]._3_1_,
                                  CONCAT15(i_1._2_1_,
                                           CONCAT14(hi[1]._2_1_,
                                                    CONCAT13(i_1._1_1_,
                                                             CONCAT12(hi[1]._1_1_,
                                                                      CONCAT11((undefined1)i_1,
                                                                               (undefined1)hi[1]))))
                                          )));
    local_c0[1] = CONCAT17(i_1._7_1_,
                           CONCAT16(hi[1]._7_1_,
                                    CONCAT15(i_1._6_1_,
                                             CONCAT14(hi[1]._6_1_,
                                                      CONCAT13(i_1._5_1_,
                                                               CONCAT12(hi[1]._5_1_,
                                                                        CONCAT11(i_1._4_1_,
                                                                                 hi[1]._4_1_)))))));
    local_c0[2] = CONCAT17(b[0]._3_1_,
                           CONCAT16(a[0]._3_1_,
                                    CONCAT15(b[0]._2_1_,
                                             CONCAT14(a[0]._2_1_,
                                                      CONCAT13(b[0]._1_1_,
                                                               CONCAT12(a[0]._1_1_,
                                                                        CONCAT11((undefined1)b[0],
                                                                                 (undefined1)a[0])))
                                                     ))));
    local_c0[3] = CONCAT17(b[0]._7_1_,
                           CONCAT16(a[0]._7_1_,
                                    CONCAT15(b[0]._6_1_,
                                             CONCAT14(a[0]._6_1_,
                                                      CONCAT13(b[0]._5_1_,
                                                               CONCAT12(a[0]._5_1_,
                                                                        CONCAT11(b[0]._4_1_,
                                                                                 a[0]._4_1_)))))));
    local_c0 = local_c0 + 4;
    local_b8 = local_b8 + 2;
    local_b0 = local_b0 + 2;
  }
  local_c8 = local_b0;
  local_d0 = local_b8;
  local_d8 = local_c0;
  for (local_130 = (in_RDX >> 5) << 5; local_130 < in_RDX; local_130 = local_130 + 1) {
    if ((local_130 & 1) == 0) {
      uVar1 = *(undefined1 *)local_c8;
      local_c8 = (undefined8 *)((long)local_c8 + 1);
    }
    else {
      uVar1 = *(undefined1 *)local_d0;
      local_d0 = (undefined8 *)((long)local_d0 + 1);
    }
    *(undefined1 *)local_d8 = uVar1;
    local_d8 = (undefined8 *)((long)local_d8 + 1);
  }
  return;
}

Assistant:

static void
interleave (uint8_t* out, const uint8_t* source, uint64_t outSize)
{
    static const uint64_t bytesPerChunk = 2 * sizeof (__m128i);
    const uint64_t        vOutSize      = outSize / bytesPerChunk;
    const __m128i*        v1            = (const __m128i*) source;
    const __m128i*        v2   = (const __m128i*) (source + (outSize + 1) / 2);
    __m128i*              vOut = (__m128i*) out;
    const uint8_t *       t1, *t2;
    uint8_t*              sOut;

    for (uint64_t i = 0; i < vOutSize; ++i)
    {
        __m128i a  = _mm_loadu_si128 (v1++);
        __m128i b  = _mm_loadu_si128 (v2++);
        __m128i lo = _mm_unpacklo_epi8 (a, b);
        __m128i hi = _mm_unpackhi_epi8 (a, b);

        _mm_storeu_si128 (vOut++, lo);
        _mm_storeu_si128 (vOut++, hi);
    }

    t1   = (const uint8_t*) v1;
    t2   = (const uint8_t*) v2;
    sOut = (uint8_t*) vOut;

    for (uint64_t i = vOutSize * bytesPerChunk; i < outSize; ++i)
        *(sOut++) = (i % 2 == 0) ? *(t1++) : *(t2++);
}